

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.cpp
# Opt level: O1

MutableStringView __thiscall Corrade::Containers::String::find(String *this,StringView substring)

{
  char *begin;
  ulong substringSize;
  BasicStringView<char> BVar1;
  MutableStringView MVar2;
  BasicStringView<char> local_28;
  
  BasicStringView<char>::BasicStringView(&local_28,this);
  substringSize = substring._sizePlusFlags & 0x3fffffffffffffff;
  begin = Implementation::stringFindString
                    (local_28._data,local_28._sizePlusFlags & 0x3fffffffffffffff,substring._data,
                     substringSize);
  if (begin == (char *)0x0) {
    BVar1 = (BasicStringView<char>)ZEXT816(0);
  }
  else {
    BVar1 = BasicStringView<char>::slice(&local_28,begin,begin + substringSize);
  }
  MVar2._data = BVar1._data;
  MVar2._sizePlusFlags = BVar1._sizePlusFlags;
  return MVar2;
}

Assistant:

MutableStringView String::find(const StringView substring) {
    /* Calling straight into the concrete implementation to reduce call stack
       depth */
    return MutableStringView{*this}.findOr(substring, nullptr);
}